

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O2

void zdd_refs_mark_task_WRAP(WorkerP *w,Task *__dq_head,TD_zdd_refs_mark_task *t)

{
  ZDD **arg_1;
  ZDD *arg_1_00;
  zdd_refs_task_t arg_1_01;
  long in_FS_OFFSET;
  
  arg_1 = (ZDD **)**(undefined8 **)(in_FS_OFFSET + -0x10);
  zdd_refs_mark_p_par_SPAWN
            (w,__dq_head,arg_1,(*(undefined8 **)(in_FS_OFFSET + -0x10))[2] - (long)arg_1 >> 3);
  arg_1_00 = *(ZDD **)(*(long *)(in_FS_OFFSET + -0x10) + 0x18);
  zdd_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,arg_1_00,
             *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x28) - (long)arg_1_00 >> 3);
  arg_1_01 = *(zdd_refs_task_t *)(*(long *)(in_FS_OFFSET + -0x10) + 0x30);
  zdd_refs_mark_s_par_CALL
            (w,__dq_head + 2,arg_1_01,
             *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x40) - (long)arg_1_01 >> 4);
  zdd_refs_mark_r_par_SYNC(w,__dq_head + 1);
  zdd_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(zdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(zdd_refs_key, zdd_refs_internal_t);
    SPAWN(zdd_refs_mark_p_par, zdd_refs_key->pbegin, zdd_refs_key->pcur-zdd_refs_key->pbegin);
    SPAWN(zdd_refs_mark_r_par, zdd_refs_key->rbegin, zdd_refs_key->rcur-zdd_refs_key->rbegin);
    CALL(zdd_refs_mark_s_par, zdd_refs_key->sbegin, zdd_refs_key->scur-zdd_refs_key->sbegin);
    SYNC(zdd_refs_mark_r_par);
    SYNC(zdd_refs_mark_p_par);
}